

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

int yy_scalar(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int yythunkpos827;
  int yypos827;
  int yythunkpos823;
  int yypos823;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  yyDo(G,yyPush,1,0,"yyPush");
  iVar7 = G->pos;
  iVar3 = G->thunkpos;
  iVar5 = yymatchChar(G,0x24);
  if ((iVar5 == 0) || (iVar5 = yy_scalar(G), iVar5 == 0)) {
    G->pos = iVar7;
    G->thunkpos = iVar3;
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    iVar5 = yymatchChar(G,0x24);
    if ((iVar5 == 0) || (iVar5 = yy_varname(G), iVar5 == 0)) {
      G->pos = iVar7;
      G->thunkpos = iVar3;
      iVar5 = yymatchString(G,"$!");
      if (iVar5 != 0) {
        iVar5 = G->pos;
        iVar4 = G->thunkpos;
        iVar6 = yymatchClass(G,(uchar *)"","a-zA-Z0-9_");
        if (iVar6 == 0) {
          G->pos = iVar5;
          G->thunkpos = iVar4;
          yyDo(G,yy_3_scalar,G->begin,G->end,"yy_3_scalar");
          goto LAB_0010c2c6;
        }
      }
      G->pos = iVar7;
      G->thunkpos = iVar3;
      iVar7 = yymatchString(G,"$/");
      if (iVar7 == 0) {
        G->pos = iVar1;
        G->thunkpos = iVar2;
        return 0;
      }
      yyDo(G,yy_4_scalar,G->begin,G->end,"yy_4_scalar");
    }
    else {
      yyText(G,G->begin,G->end);
      G->end = G->pos;
      yyDo(G,yy_2_scalar,G->begin,G->end,"yy_2_scalar");
    }
  }
  else {
    yyDo(G,yySet,-1,0,"yySet");
    yyDo(G,yy_1_scalar,G->begin,G->end,"yy_1_scalar");
  }
LAB_0010c2c6:
  yyDo(G,yyPop,1,0,"yyPop");
  return 1;
}

Assistant:

YY_RULE(int) yy_scalar(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 1, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "scalar"));

  {  int yypos823= G->pos, yythunkpos823= G->thunkpos;  if (!yymatchChar(G, '$')) goto l824;
  if (!yy_scalar(G))  goto l824;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_1_scalar, G->begin, G->end, "yy_1_scalar");
  goto l823;
  l824:;	  G->pos= yypos823; G->thunkpos= yythunkpos823;  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l825;  if (!yymatchChar(G, '$')) goto l825;
  if (!yy_varname(G))  goto l825;
  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l825;  yyDo(G, yy_2_scalar, G->begin, G->end, "yy_2_scalar");
  goto l823;
  l825:;	  G->pos= yypos823; G->thunkpos= yythunkpos823;  if (!yymatchString(G, "$!")) goto l826;

  {  int yypos827= G->pos, yythunkpos827= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z0-9_")) goto l827;
  goto l826;
  l827:;	  G->pos= yypos827; G->thunkpos= yythunkpos827;
  }  yyDo(G, yy_3_scalar, G->begin, G->end, "yy_3_scalar");
  goto l823;
  l826:;	  G->pos= yypos823; G->thunkpos= yythunkpos823;  if (!yymatchString(G, "$/")) goto l822;
  yyDo(G, yy_4_scalar, G->begin, G->end, "yy_4_scalar");

  }
  l823:;	  yyprintf((stderr, "  ok   scalar"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 1, 0, "yyPop");
  return 1;
  l822:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "scalar"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}